

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

Array * __thiscall
spvtools::opt::InstrumentPass::GetArray(InstrumentPass *this,Type *element,uint32_t length)

{
  initializer_list<unsigned_int> __l;
  int iVar1;
  IRContext *pIVar2;
  ConstantManager *this_00;
  TypeManager *this_01;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar4;
  Type *type;
  Array r;
  uint local_58;
  uint32_t local_54;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  LengthInfo length_info;
  uint32_t length_id;
  uint32_t length_local;
  Type *element_local;
  InstrumentPass *this_local;
  
  length_info.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = length;
  pIVar2 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_constant_mgr(pIVar2);
  local_40._0_4_ =
       analysis::ConstantManager::GetUIntConstId
                 (this_00,length_info.words.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_);
  local_58 = 0;
  local_54 = length_info.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  local_50 = &local_58;
  local_48 = 2;
  length_info.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = local_40._0_4_;
  std::allocator<unsigned_int>::allocator
            ((allocator<unsigned_int> *)
             ((long)&r.length_info_.words.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&length_info,__l,
             (allocator_type *)
             ((long)&r.length_info_.words.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&r.length_info_.words.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  analysis::Array::Array((Array *)&type,element,(LengthInfo *)local_40);
  pIVar2 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(pIVar2);
  pTVar3 = analysis::TypeManager::GetRegisteredType(this_01,(Type *)&type);
  bVar4 = false;
  if (pTVar3 != (Type *)0x0) {
    iVar1 = (*pTVar3->_vptr_Type[0x17])();
    bVar4 = CONCAT44(extraout_var,iVar1) != 0;
  }
  if (!bVar4) {
    __assert_fail("type && type->AsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                  ,0x19f,
                  "analysis::Array *spvtools::opt::InstrumentPass::GetArray(const analysis::Type *, uint32_t)"
                 );
  }
  iVar1 = (*pTVar3->_vptr_Type[0x17])();
  analysis::Array::~Array((Array *)&type);
  analysis::Array::LengthInfo::~LengthInfo((LengthInfo *)local_40);
  return (Array *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

analysis::Array* InstrumentPass::GetArray(const analysis::Type* element,
                                          uint32_t length) {
  uint32_t length_id = context()->get_constant_mgr()->GetUIntConstId(length);
  analysis::Array::LengthInfo length_info{
      length_id, {analysis::Array::LengthInfo::Case::kConstant, length}};

  analysis::Array r(element, length_info);

  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&r);
  assert(type && type->AsArray());
  return type->AsArray();
}